

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

printer * __thiscall
boost::ext::ut::v1_1_8::printer::operator<<
          (printer *this,
          eq_<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
          *op)

{
  bool cond;
  printer *ppVar1;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  string_view local_28;
  eq_<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_18;
  eq_<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *op_local;
  printer *this_local;
  
  local_18 = op;
  op_local = (eq_<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
              *)this;
  cond = detail::eq_::operator_cast_to_bool((eq_ *)op);
  local_28 = color(this,cond);
  ppVar1 = operator<<(this,&local_28);
  local_38 = detail::
             eq_<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
             ::lhs(local_18);
  ppVar1 = operator<<(ppVar1,&local_38);
  ppVar1 = operator<<(ppVar1,(char (*) [5])" == ");
  local_48 = detail::
             eq_<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
             ::rhs(local_18);
  ppVar1 = operator<<(ppVar1,&local_48);
  ppVar1 = operator<<(ppVar1,(basic_string_view<char,_std::char_traits<char>_> *)this);
  return ppVar1;
}

Assistant:

auto& operator<<(const detail::eq_<TLhs, TRhs>& op) {
      return (*this << color(op) << op.lhs() << " == " << op.rhs()
                    << colors_.none);
    }